

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
* __thiscall
ninx::lexer::Lexer::generate
          (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  reference this_03;
  type a;
  ostream *this_04;
  unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_> *token_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *__range2;
  string local_110;
  undefined1 local_ec [12];
  __single_object token;
  char local_d4 [4];
  unique_ptr<ninx::lexer::token::Limiter,_std::default_delete<ninx::lexer::token::Limiter>_>
  local_d0;
  __single_object limiterToken;
  string local_c0;
  undefined1 local_9c [12];
  __single_object variableToken;
  int trailing_spaces_1;
  string local_80;
  undefined1 local_5c [12];
  __single_object keywordToken;
  bool local_45;
  int trailing_spaces;
  bool lateSelectorFound;
  int local_34;
  undefined1 local_30 [4];
  int next_limiter;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  Lexer *this_local;
  
  tokens.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
            *)local_30);
  while (local_34 = Reader::get_next_limiter(&this->reader), local_34 != -1) {
    if (local_34 < 1) {
      local_ec._0_4_ = Reader::get_line_number(&this->reader);
      Reader::read_until_limiter_abi_cxx11_(&local_110,&this->reader);
      std::make_unique<ninx::lexer::token::Text,int,std::__cxx11::string>
                ((int *)(local_ec + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec);
      std::__cxx11::string::~string((string *)&local_110);
      this_02 = std::
                unique_ptr<ninx::lexer::token::Text,_std::default_delete<ninx::lexer::token::Text>_>
                ::operator->((unique_ptr<ninx::lexer::token::Text,_std::default_delete<ninx::lexer::token::Text>_>
                              *)(local_ec + 4));
      bVar1 = lexer::token::Text::is_empty(this_02);
      if (!bVar1) {
        std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>::
        unique_ptr<ninx::lexer::token::Text,std::default_delete<ninx::lexer::token::Text>,void>
                  ((unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>
                    *)&__range2,
                   (unique_ptr<ninx::lexer::token::Text,_std::default_delete<ninx::lexer::token::Text>_>
                    *)(local_ec + 4));
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        ::push_back((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)local_30,(value_type *)&__range2);
        std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
        ::~unique_ptr((unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                       *)&__range2);
      }
      std::unique_ptr<ninx::lexer::token::Text,_std::default_delete<ninx::lexer::token::Text>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Text,_std::default_delete<ninx::lexer::token::Text>_>
                   *)(local_ec + 4));
    }
    else if (local_34 == 0x24) {
      local_9c._0_4_ = Reader::get_line_number(&this->reader);
      Reader::read_identifier_abi_cxx11_
                (&local_c0,&this->reader,
                 (int *)((long)&variableToken._M_t.
                                super___uniq_ptr_impl<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ninx::lexer::token::Variable_*,_std::default_delete<ninx::lexer::token::Variable>_>
                                .super__Head_base<0UL,_ninx::lexer::token::Variable_*,_false>.
                                _M_head_impl + 4));
      std::make_unique<ninx::lexer::token::Variable,int,std::__cxx11::string>
                ((int *)(local_9c + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c);
      std::__cxx11::string::~string((string *)&local_c0);
      this_01 = std::
                unique_ptr<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                ::operator->((unique_ptr<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                              *)(local_9c + 4));
      lexer::token::Variable::set_trailing_spaces
                (this_01,variableToken._M_t.
                         super___uniq_ptr_impl<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ninx::lexer::token::Variable_*,_std::default_delete<ninx::lexer::token::Variable>_>
                         .super__Head_base<0UL,_ninx::lexer::token::Variable_*,_false>._M_head_impl.
                         _4_4_);
      std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>::
      unique_ptr<ninx::lexer::token::Variable,std::default_delete<ninx::lexer::token::Variable>,void>
                ((unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>
                  *)&limiterToken,
                 (unique_ptr<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                  *)(local_9c + 4));
      std::
      vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ::push_back((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                   *)local_30,(value_type *)&limiterToken);
      std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                   *)&limiterToken);
      std::
      unique_ptr<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Variable,_std::default_delete<ninx::lexer::token::Variable>_>
                   *)(local_9c + 4));
    }
    else if (local_34 == 0x40) {
      local_45 = false;
      local_5c._0_4_ = Reader::get_line_number(&this->reader);
      Reader::read_identifier_abi_cxx11_
                (&local_80,&this->reader,
                 (int *)((long)&keywordToken._M_t.
                                super___uniq_ptr_impl<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ninx::lexer::token::Keyword_*,_std::default_delete<ninx::lexer::token::Keyword>_>
                                .super__Head_base<0UL,_ninx::lexer::token::Keyword_*,_false>.
                                _M_head_impl + 4),0x3f,&local_45);
      std::make_unique<ninx::lexer::token::Keyword,int,std::__cxx11::string>
                ((int *)(local_5c + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c);
      std::__cxx11::string::~string((string *)&local_80);
      if ((local_45 & 1U) != 0) {
        this_00 = std::
                  unique_ptr<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>
                  ::operator->((unique_ptr<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>
                                *)(local_5c + 4));
        lexer::token::Keyword::set_late(this_00,true);
      }
      std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>::
      unique_ptr<ninx::lexer::token::Keyword,std::default_delete<ninx::lexer::token::Keyword>,void>
                ((unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>
                  *)&stack0xffffffffffffff78,
                 (unique_ptr<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>
                  *)(local_5c + 4));
      std::
      vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ::push_back((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                   *)local_30,(value_type *)&stack0xffffffffffffff78);
      std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                   *)&stack0xffffffffffffff78);
      std::
      unique_ptr<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Keyword,_std::default_delete<ninx::lexer::token::Keyword>_>
                   *)(local_5c + 4));
    }
    else {
      local_d4 = (char  [4])Reader::get_line_number(&this->reader);
      std::make_unique<ninx::lexer::token::Limiter,int,char>((int *)&local_d0,local_d4);
      std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>::
      unique_ptr<ninx::lexer::token::Limiter,std::default_delete<ninx::lexer::token::Limiter>,void>
                ((unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>
                  *)&token,&local_d0);
      std::
      vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
      ::push_back((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                   *)local_30,(value_type *)&token);
      std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>::
      ~unique_ptr((unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                   *)&token);
      std::
      unique_ptr<ninx::lexer::token::Limiter,_std::default_delete<ninx::lexer::token::Limiter>_>::
      ~unique_ptr(&local_d0);
    }
  }
  if ((this->verbose & 1U) != 0) {
    __end2 = std::
             vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             ::begin((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                      *)local_30);
    token_1 = (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
               *)std::
                 vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                 ::end((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                        *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_*,_std::vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>_>
                                       *)&token_1), bVar1) {
      this_03 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_*,_std::vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>_>
                ::operator*(&__end2);
      a = std::
          unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>::
          operator*(this_03);
      this_04 = lexer::token::operator<<((ostream *)std::cout,a);
      std::ostream::operator<<(this_04,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_*,_std::vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
            *)local_30);
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Token>> ninx::lexer::Lexer::generate() {
    std::vector<std::unique_ptr<Token>> tokens;

    while(true) {
        int next_limiter = reader.get_next_limiter();
        if (next_limiter == -1) {  // EOF
            break;
        }

        if (next_limiter > 0) {  // A limiter was found
            switch (next_limiter) {
                case '@':  // Keyword beginning
                {
                    bool lateSelectorFound = false;
                    int trailing_spaces;
                    auto keywordToken = std::make_unique<Keyword>(reader.get_line_number(), reader.read_identifier(trailing_spaces, '?', lateSelectorFound));

                    if (lateSelectorFound) {
                        keywordToken->set_late(true);
                    }

                    tokens.push_back(std::move(keywordToken));
                    break;
                }
                case '$':  // Variable beginning
                {
                    int trailing_spaces;
                    auto variableToken = std::make_unique<Variable>(reader.get_line_number(),
                                                                    reader.read_identifier(trailing_spaces));
                    variableToken->set_trailing_spaces(trailing_spaces);
                    tokens.push_back(std::move(variableToken));
                    break;
                }
                default:   // Other limiters, mark them as generic limiters
                {
                    auto limiterToken = std::make_unique<Limiter>(reader.get_line_number(), static_cast<char>(next_limiter));
                    tokens.push_back(std::move(limiterToken));
                }
            }
        }else{  // A limiter was not found, it is a simple text
            auto token = std::make_unique<Text>(reader.get_line_number(), reader.read_until_limiter());
            // Only add non-empty tokens
            if (!token->is_empty()) {
                tokens.push_back(std::move(token));
            }
        }
    }

    if (verbose) {
        for (auto &token : tokens) {
            std::cout << *token << std::endl;
        }
    }

    return std::move(tokens);
}